

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test_smoothsort(uint N_lists,uint list_max)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  time_t tVar5;
  ostream *poVar6;
  int *data;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong _N;
  uint N;
  sorted_ptr_arr<int> local_40;
  
  uVar7 = 0;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sorting ",8);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," lists of at most ",0x12);
  _N = (ulong)list_max;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," elements each...",0x11);
  if (N_lists != 0) {
    do {
      data = (int *)operator_new__(_N * 4);
      if (list_max != 0) {
        uVar9 = 0;
        do {
          iVar4 = rand();
          data[uVar9] = (int)(((double)iVar4 * 100.0) / 2147483647.0);
          uVar9 = uVar9 + 1;
        } while (_N != uVar9);
      }
      local_40.ptr_arr = (smoothsort_ptr<int> *)0x0;
      local_40.N = _N;
      sorted_ptr_arr<int>::assign(&local_40,data,_N);
      sorted_ptr_arr<int>::sort(&local_40);
      if (local_40.N != 0) {
        lVar8 = 0;
        bVar3 = 0;
        do {
          bVar2 = bVar3;
          bVar1 = **(int **)((long)&(local_40.ptr_arr)->element + lVar8) <
                  *(local_40.ptr_arr)->element;
          lVar8 = lVar8 + 8;
          bVar3 = bVar2 | bVar1;
        } while (local_40.N << 3 != lVar8);
        if ((bool)(bVar2 | bVar1)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# NOT SORTED",0xc);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
        }
      }
      operator_delete__(data);
      if (local_40.ptr_arr != (smoothsort_ptr<int> *)0x0) {
        operator_delete__(local_40.ptr_arr);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != N_lists);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void test_smoothsort(unsigned int N_lists, unsigned int list_max) {
	srand(time(NULL));
	
	std::cout << "Sorting " << N_lists << " lists of at most " << list_max << " elements each..."; 
	for(unsigned int k=0; k<N_lists; k++) {
		unsigned int N = list_max;//= (int)((double)list_max*(double)rand()/(double)RAND_MAX)+1;
		int* test_input = new int[N];
		int* input_copy = new int[N];
		for(unsigned int i=0; i<N; i++) { test_input[i] = (int)(100*(double)rand()/(double)RAND_MAX); input_copy[i] = test_input[i]; }
		
		//std::cout << std::endl;
		//for(unsigned int i=0; i<N; i++) { std::cout << test_input[i] << "\t"; }
		//std::cout << std::endl << std::endl;
		
		sorted_ptr_arr<int> sorted_data(&test_input[0], N);
		int last = sorted_data[0];
		bool not_sorted = false;
		for(sorted_ptr_arr<int>::iterator it=sorted_data.begin(); it != sorted_data.end(); ++it) {
			if(last > *it) { not_sorted = true; }
			//std::cout << *it << "\t";
		}
		//std::cout << std::endl;
		if(not_sorted) { std::cout << "# NOT SORTED" << std::endl; }
		//std::cout << std::endl;
		
		
		delete[] test_input;
		delete[] input_copy;
	}
	std::cout << "Done." << std::endl;
}